

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

int QString::localeAwareCompare_helper
              (QChar *data1,qsizetype length1,QChar *data2,qsizetype length2)

{
  QStringView lhs;
  QStringView s2;
  QStringView rhs;
  int iVar1;
  long in_RCX;
  QChar *in_RDX;
  QStringView *in_RSI;
  long in_FS_OFFSET;
  qsizetype unaff_retaddr;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  storage_type_conflict *in_stack_ffffffffffffffb8;
  QStringView in_stack_ffffffffffffffc0;
  CaseSensitivity in_stack_ffffffffffffffe8;
  qsizetype in_stack_fffffffffffffff0;
  storage_type_conflict *psVar2;
  
  psVar2 = *(storage_type_conflict **)(in_FS_OFFSET + 0x28);
  if ((in_RSI == (QStringView *)0x0) || (in_RCX == 0)) {
    QStringView::QStringView<QChar,_true>(in_RSI,in_RDX,in_RCX);
    QStringView::QStringView<QChar,_true>(in_RSI,in_RDX,in_RCX);
    lhs.m_data = (storage_type_conflict *)length2;
    lhs.m_size = unaff_retaddr;
    rhs.m_data = psVar2;
    rhs.m_size = in_stack_fffffffffffffff0;
    iVar1 = QtPrivate::compareStrings(lhs,rhs,in_stack_ffffffffffffffe8);
  }
  else {
    QStringView::QStringView<QChar,_true>(in_RSI,in_RDX,in_RCX);
    QStringView::QStringView<QChar,_true>(in_RSI,in_RDX,in_RCX);
    s2.m_size._4_4_ = in_stack_ffffffffffffffb4;
    s2.m_size._0_4_ = in_stack_ffffffffffffffb0;
    s2.m_data = in_stack_ffffffffffffffb8;
    iVar1 = QCollator::defaultCompare(in_stack_ffffffffffffffc0,s2);
  }
  if (*(storage_type_conflict **)(in_FS_OFFSET + 0x28) == psVar2) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QString::localeAwareCompare_helper(const QChar *data1, qsizetype length1,
                                       const QChar *data2, qsizetype length2)
{
    Q_ASSERT(length1 >= 0);
    Q_ASSERT(data1 || length1 == 0);
    Q_ASSERT(length2 >= 0);
    Q_ASSERT(data2 || length2 == 0);

    // do the right thing for null and empty
    if (length1 == 0 || length2 == 0)
        return QtPrivate::compareStrings(QStringView(data1, length1), QStringView(data2, length2),
                               Qt::CaseSensitive);

#if QT_CONFIG(icu)
    return QCollator::defaultCompare(QStringView(data1, length1), QStringView(data2, length2));
#else
    const QString lhs = QString::fromRawData(data1, length1).normalized(QString::NormalizationForm_C);
    const QString rhs = QString::fromRawData(data2, length2).normalized(QString::NormalizationForm_C);
#  if defined(Q_OS_WIN)
    int res = CompareStringEx(LOCALE_NAME_USER_DEFAULT, 0, (LPWSTR)lhs.constData(), lhs.length(), (LPWSTR)rhs.constData(), rhs.length(), NULL, NULL, 0);

    switch (res) {
    case CSTR_LESS_THAN:
        return -1;
    case CSTR_GREATER_THAN:
        return 1;
    default:
        return 0;
    }
#  elif defined (Q_OS_DARWIN)
    // Use CFStringCompare for comparing strings on Mac. This makes Qt order
    // strings the same way as native applications do, and also respects
    // the "Order for sorted lists" setting in the International preferences
    // panel.
    const CFStringRef thisString =
        CFStringCreateWithCharactersNoCopy(kCFAllocatorDefault,
            reinterpret_cast<const UniChar *>(lhs.constData()), lhs.length(), kCFAllocatorNull);
    const CFStringRef otherString =
        CFStringCreateWithCharactersNoCopy(kCFAllocatorDefault,
            reinterpret_cast<const UniChar *>(rhs.constData()), rhs.length(), kCFAllocatorNull);

    const int result = CFStringCompare(thisString, otherString, kCFCompareLocalized);
    CFRelease(thisString);
    CFRelease(otherString);
    return result;
#  elif defined(Q_OS_UNIX)
    // declared in <string.h> (no better than QtPrivate::compareStrings() on Android, sadly)
    return strcoll(lhs.toLocal8Bit().constData(), rhs.toLocal8Bit().constData());
#  else
#     error "This case shouldn't happen"
    return QtPrivate::compareStrings(lhs, rhs, Qt::CaseSensitive);
#  endif
#endif // !QT_CONFIG(icu)
}